

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tri_jac_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_298;
  double local_288;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_DBL l2;
  REF_DBL a;
  REF_DBL n [3];
  double local_228;
  REF_DBL e2 [3];
  double local_208;
  REF_DBL e1 [3];
  double local_1e8;
  REF_DBL e0 [3];
  REF_DBL local_1c8;
  REF_DBL xyz2 [3];
  REF_DBL local_1a8;
  REF_DBL xyz1 [3];
  REF_DBL local_188;
  REF_DBL xyz0 [3];
  REF_DBL local_168;
  REF_DBL jac [9];
  REF_DBL local_118;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,*nodes,mlog1 + 5);
  if (ref_node_local._4_4_ == 0) {
    ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[1],mlog2 + 5);
    if (ref_node_local._4_4_ == 0) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[2],mlog + 5);
      if (ref_node_local._4_4_ == 0) {
        for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
            ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
          m[(long)ref_private_macro_code_rss_1 + 5] =
               (mlog1[(long)ref_private_macro_code_rss_1 + 5] +
                mlog2[(long)ref_private_macro_code_rss_1 + 5] +
               mlog[(long)ref_private_macro_code_rss_1 + 5]) / 3.0;
        }
        ref_node_local._4_4_ = ref_matrix_exp_m(m + 5,&local_118);
        if (ref_node_local._4_4_ == 0) {
          ref_node_local._4_4_ = ref_matrix_jacob_m(&local_118,&local_168);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ =
                 ref_matrix_vect_mult(&local_168,ref_node->real + *nodes * 0xf,&local_188);
            if (ref_node_local._4_4_ == 0) {
              ref_node_local._4_4_ =
                   ref_matrix_vect_mult(&local_168,ref_node->real + nodes[1] * 0xf,&local_1a8);
              if (ref_node_local._4_4_ == 0) {
                ref_node_local._4_4_ =
                     ref_matrix_vect_mult(&local_168,ref_node->real + nodes[2] * 0xf,&local_1c8);
                if (ref_node_local._4_4_ == 0) {
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    e0[(long)ref_private_macro_code_rss_1 + -1] =
                         xyz2[(long)ref_private_macro_code_rss_1 + -1] -
                         xyz1[(long)ref_private_macro_code_rss_1 + -1];
                  }
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    e1[(long)ref_private_macro_code_rss_1 + -1] =
                         xyz0[(long)ref_private_macro_code_rss_1 + -1] -
                         xyz2[(long)ref_private_macro_code_rss_1 + -1];
                  }
                  for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 3;
                      ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                    e2[(long)ref_private_macro_code_rss_1 + -1] =
                         xyz1[(long)ref_private_macro_code_rss_1 + -1] -
                         xyz0[(long)ref_private_macro_code_rss_1 + -1];
                  }
                  dVar1 = e2[0] * e0[1] + -(e2[1] * e0[0]);
                  dVar2 = e2[1] * local_1e8 + -(local_228 * e0[1]);
                  dVar3 = local_228 * e0[0] + -(e2[0] * local_1e8);
                  dVar4 = e0[1] * e0[1] + local_1e8 * local_1e8 + e0[0] * e0[0] +
                          e1[1] * e1[1] + local_208 * local_208 + e1[0] * e1[0] +
                          e2[1] * e2[1] + local_228 * local_228 + e2[0] * e2[0];
                  dVar1 = sqrt(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2);
                  dVar1 = dVar1 * 0.5;
                  if (dVar4 * 1e+20 <= 0.0) {
                    local_288 = -(dVar4 * 1e+20);
                  }
                  else {
                    local_288 = dVar4 * 1e+20;
                  }
                  local_298 = dVar1;
                  if (dVar1 <= 0.0) {
                    local_298 = -dVar1;
                  }
                  if (local_288 <= local_298) {
                    *quality = -1.0;
                  }
                  else {
                    dVar2 = sqrt(3.0);
                    *quality = dVar2 * 4.0 * (dVar1 / dVar4);
                  }
                  ref_node_local._4_4_ = 0;
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x7ed,"ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"xyz2");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x7eb,"ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"xyz1");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x7e9,"ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"xyz0");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x7e6,"ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"jac");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x7e5,"ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"exp");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x7e3,"ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"log2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7e2,
             "ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"log1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7e1,
           "ref_node_tri_jac_quality",(ulong)ref_node_local._4_4_,"log0");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tri_jac_quality(REF_NODE ref_node,
                                                   REF_INT *nodes,
                                                   REF_DBL *quality) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6];
  REF_DBL mlog[6], m[6], jac[9];
  REF_DBL xyz0[3], xyz1[3], xyz2[3];
  REF_DBL e0[3], e1[3], e2[3], n[3];
  REF_DBL a, l2;
  REF_INT i;

  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  for (i = 0; i < 6; i++) mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i]) / 3.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_jacob_m(m, jac), "jac");

  RSS(ref_matrix_vect_mult(jac, ref_node_xyz_ptr(ref_node, nodes[0]), xyz0),
      "xyz0");
  RSS(ref_matrix_vect_mult(jac, ref_node_xyz_ptr(ref_node, nodes[1]), xyz1),
      "xyz1");
  RSS(ref_matrix_vect_mult(jac, ref_node_xyz_ptr(ref_node, nodes[2]), xyz2),
      "xyz2");

  for (i = 0; i < 3; i++) e0[i] = xyz2[i] - xyz1[i];
  for (i = 0; i < 3; i++) e1[i] = xyz0[i] - xyz2[i];
  for (i = 0; i < 3; i++) e2[i] = xyz1[i] - xyz0[i];

  ref_math_cross_product(e2, e0, n);
  l2 = ref_math_dot(e0, e0) + ref_math_dot(e1, e1) + ref_math_dot(e2, e2);

  a = 0.5 * sqrt(ref_math_dot(n, n));

  if (ref_math_divisible(a, l2)) {
    *quality = 4.0 * sqrt(3.0) * (a / l2);
  } else {
    /* printf("%s: %d: %s: div zero area %.18e l2 %.18e\n", __FILE__, __LINE__,
       __func__, a, l2); */
    *quality = -1.0;
  }

  return REF_SUCCESS;
}